

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O2

aom_image_t *
img_alloc_helper(aom_image_t *img,aom_img_fmt_t fmt,uint d_w,uint d_h,uint buf_align,
                uint stride_align,uint size_align,uint border,uchar *img_data,
                aom_alloc_img_data_cb_fn_t alloc_cb,void *cb_priv)

{
  uint uVar1;
  ulong uVar2;
  size_t size;
  void *pvVar3;
  uchar *puVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  uint local_6c;
  
  if (img != (aom_image_t *)0x0) {
    memset(img,0,0xa8);
  }
  if ((fmt == AOM_IMG_FMT_NONE) ||
     (0x10000 < border ||
      (0x10000 < size_align ||
      ((0x10000 < stride_align || 0x10000 < buf_align) || (0x8000000 < d_h || 0x8000000 < d_w))))) {
LAB_0015ebe0:
    aom_img_free(img);
    img = (aom_image_t *)0x0;
  }
  else {
    uVar12 = buf_align + (buf_align == 0);
    uVar14 = uVar12 - 1;
    if (((uVar12 & uVar14) != 0) ||
       ((uVar13 = stride_align + (stride_align == 0), (uVar13 & uVar13 - 1) != 0 ||
        (uVar1 = size_align + (size_align == 0), (uVar1 & uVar1 - 1) != 0)))) goto LAB_0015ebe0;
    uVar10 = 0xc;
    uVar8 = fmt - AOM_IMG_FMT_I420;
    uVar9 = 1;
    local_6c = uVar9;
    switch(uVar8) {
    case 0:
    case 2:
    case 5:
      break;
    case 1:
switchD_0015e8d2_caseD_1:
      uVar10 = 0x10;
      break;
    case 3:
      uVar10 = 0x10;
LAB_0015e937:
      bVar16 = (fmt & 0x800) == AOM_IMG_FMT_NONE;
      uVar11 = ((fmt & 0x800) >> 8) + 8;
      goto LAB_0015e979;
    case 4:
      uVar10 = 0x18;
LAB_0015e958:
      bVar16 = (fmt & 0x800) == AOM_IMG_FMT_NONE;
      uVar11 = ((fmt & 0x800) >> 8) + 8;
      goto LAB_0015e971;
    default:
      if ((fmt != AOM_IMG_FMT_YV12) && (fmt != AOM_IMG_FMT_AOMYV12)) {
        if (fmt != AOM_IMG_FMT_YV1216) {
          if (fmt == AOM_IMG_FMT_I42216) {
            uVar10 = 0x20;
            goto LAB_0015e937;
          }
          if (fmt == AOM_IMG_FMT_I44416) {
            uVar10 = 0x30;
            goto LAB_0015e958;
          }
          if (fmt != AOM_IMG_FMT_I42016) goto switchD_0015e8d2_caseD_1;
        }
        uVar10 = 0x18;
      }
    }
    bVar16 = (fmt & 0x800) == AOM_IMG_FMT_NONE;
    uVar11 = ((fmt & 0x800) >> 8) + 8;
    if ((((5 < uVar8) || ((0x2dU >> (uVar8 & 0x1f) & 1) == 0)) && (fmt != AOM_IMG_FMT_YV12)) &&
       (((fmt != AOM_IMG_FMT_AOMYV12 && (fmt != AOM_IMG_FMT_I42016)) &&
        ((fmt != AOM_IMG_FMT_I42216 && (fmt != AOM_IMG_FMT_YV1216)))))) {
LAB_0015e971:
      local_6c = 0;
    }
LAB_0015e979:
    if (((5 < uVar8) || ((0x25U >> (uVar8 & 0x1f) & 1) == 0)) &&
       ((fmt != AOM_IMG_FMT_YV12 &&
        (((fmt != AOM_IMG_FMT_AOMYV12 && (fmt != AOM_IMG_FMT_I42016)) && (fmt != AOM_IMG_FMT_YV1216)
         ))))) {
      uVar9 = 0;
    }
    uVar8 = -1 << (sbyte)local_6c;
    uVar1 = -uVar1;
    if (uVar1 <= uVar8) {
      uVar8 = uVar1;
    }
    uVar7 = -1 << (sbyte)uVar9;
    uVar8 = ~uVar8 + d_w & uVar8;
    if (uVar1 <= uVar7) {
      uVar7 = uVar1;
    }
    uVar2 = (ulong)(border * 2) + (ulong)uVar8;
    bVar5 = 4 - bVar16;
    uVar15 = uVar2 * uVar10 >> (bVar5 & 0x3f);
    if ((fmt >> 8 & 1) != 0) {
      uVar15 = uVar2;
    }
    if (img == (aom_image_t *)0x0) {
      img = (aom_image_t *)calloc(1,0xa8);
      if (img == (aom_image_t *)0x0) {
        img = (aom_image_t *)0x0;
        goto LAB_0015ebe0;
      }
      img->self_allocd = 1;
    }
    uVar7 = ~uVar7 + d_h & uVar7;
    uVar15 = -(ulong)uVar13 & ((ulong)uVar13 + ((uVar15 << (bVar5 & 0x3f)) >> 3)) - 1;
    img->img_data = img_data;
    if (img_data == (uchar *)0x0) {
      uVar2 = (ulong)(border * 2 + uVar7);
      if ((fmt >> 8 & 1) == 0) {
        size = uVar2 * uVar15;
      }
      else {
        size = uVar10 * uVar15 * uVar2 >> (bVar5 & 0x3f);
      }
      if (alloc_cb == (aom_alloc_img_data_cb_fn_t)0x0) {
        puVar4 = (uchar *)aom_memalign((ulong)uVar12,size);
        iVar6 = 1;
      }
      else {
        pvVar3 = (*alloc_cb)(cb_priv,(size + uVar12) - 1);
        puVar4 = (uchar *)(~(ulong)uVar14 & (long)pvVar3 + (ulong)uVar14);
        if (pvVar3 == (void *)0x0) {
          puVar4 = (uchar *)0x0;
        }
        iVar6 = 0;
      }
      img->img_data = puVar4;
      img->img_data_owner = iVar6;
      img->sz = size;
      if (puVar4 == (uchar *)0x0) goto LAB_0015ebe0;
    }
    img->fmt = fmt;
    img->bit_depth = uVar11;
    img->w = uVar8;
    img->h = uVar7;
    img->x_chroma_shift = local_6c;
    img->y_chroma_shift = uVar9;
    img->bps = uVar10;
    img->stride[0] = (uint)uVar15;
    uVar14 = (uint)uVar15 >> (sbyte)local_6c;
    img->stride[2] = uVar14;
    img->stride[1] = uVar14;
    if (fmt == AOM_IMG_FMT_NV12) {
      img->stride[1] = uVar14 * 2;
      img->stride[2] = 0;
    }
    img->cp = AOM_CICP_CP_UNSPECIFIED;
    img->tc = AOM_CICP_TC_UNSPECIFIED;
    img->mc = AOM_CICP_MC_UNSPECIFIED;
    aom_img_set_rect(img,0,0,d_w,d_h,border);
  }
  return img;
}

Assistant:

static aom_image_t *img_alloc_helper(
    aom_image_t *img, aom_img_fmt_t fmt, unsigned int d_w, unsigned int d_h,
    unsigned int buf_align, unsigned int stride_align, unsigned int size_align,
    unsigned int border, unsigned char *img_data,
    aom_alloc_img_data_cb_fn_t alloc_cb, void *cb_priv) {
  /* NOTE: In this function, bit_depth is either 8 or 16 (if
   * AOM_IMG_FMT_HIGHBITDEPTH is set), never 10 or 12.
   */
  unsigned int xcs, ycs, bps, bit_depth;

  if (img != NULL) memset(img, 0, sizeof(aom_image_t));

  if (fmt == AOM_IMG_FMT_NONE) goto fail;

  /* Impose maximum values on input parameters so that this function can
   * perform arithmetic operations without worrying about overflows.
   */
  if (d_w > 0x08000000 || d_h > 0x08000000 || buf_align > 65536 ||
      stride_align > 65536 || size_align > 65536 || border > 65536) {
    goto fail;
  }

  /* Treat align==0 like align==1 */
  if (!buf_align) buf_align = 1;

  /* Validate alignment (must be power of 2) */
  if (buf_align & (buf_align - 1)) goto fail;

  /* Treat align==0 like align==1 */
  if (!stride_align) stride_align = 1;

  /* Validate alignment (must be power of 2) */
  if (stride_align & (stride_align - 1)) goto fail;

  /* Treat align==0 like align==1 */
  if (!size_align) size_align = 1;

  /* Validate alignment (must be power of 2) */
  if (size_align & (size_align - 1)) goto fail;

  /* Get sample size for this format */
  switch (fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_AOMYV12: bps = 12; break;
    case AOM_IMG_FMT_I422: bps = 16; break;
    case AOM_IMG_FMT_I444: bps = 24; break;
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42016: bps = 24; break;
    case AOM_IMG_FMT_I42216: bps = 32; break;
    case AOM_IMG_FMT_I44416: bps = 48; break;
    default: bps = 16; break;
  }

  bit_depth = (fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 16 : 8;

  /* Get chroma shift values for this format */
  switch (fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_AOMYV12:
    case AOM_IMG_FMT_I422:
    case AOM_IMG_FMT_I42016:
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42216: xcs = 1; break;
    default: xcs = 0; break;
  }

  switch (fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_AOMYV12:
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42016: ycs = 1; break;
    default: ycs = 0; break;
  }

  /* Calculate storage sizes given the chroma subsampling */
  const unsigned int w = align_image_dimension(d_w, xcs, size_align);
  assert(d_w <= w);
  const unsigned int h = align_image_dimension(d_h, ycs, size_align);
  assert(d_h <= h);

  uint64_t s = (uint64_t)w + 2 * border;
  s = (fmt & AOM_IMG_FMT_PLANAR) ? s : s * bps / bit_depth;
  s = s * bit_depth / 8;
  s = (s + stride_align - 1) & ~((uint64_t)stride_align - 1);
  if (s > INT_MAX) goto fail;
  const int stride_in_bytes = (int)s;

  /* Allocate the new image */
  if (!img) {
    img = (aom_image_t *)calloc(1, sizeof(aom_image_t));

    if (!img) goto fail;

    img->self_allocd = 1;
  }

  img->img_data = img_data;

  if (!img_data) {
    const uint64_t alloc_size =
        (fmt & AOM_IMG_FMT_PLANAR)
            ? (uint64_t)(h + 2 * border) * stride_in_bytes * bps / bit_depth
            : (uint64_t)(h + 2 * border) * stride_in_bytes;

    if (alloc_size != (size_t)alloc_size) goto fail;

    if (alloc_cb) {
      const size_t padded_alloc_size = (size_t)alloc_size + buf_align - 1;
      img->img_data = (uint8_t *)alloc_cb(cb_priv, padded_alloc_size);
      if (img->img_data) {
        img->img_data = (uint8_t *)aom_align_addr(img->img_data, buf_align);
      }
      img->img_data_owner = 0;
    } else {
      img->img_data = (uint8_t *)aom_memalign(buf_align, (size_t)alloc_size);
      img->img_data_owner = 1;
    }
    img->sz = (size_t)alloc_size;
  }

  if (!img->img_data) goto fail;

  img->fmt = fmt;
  img->bit_depth = bit_depth;
  // aligned width and aligned height
  img->w = w;
  img->h = h;
  img->x_chroma_shift = xcs;
  img->y_chroma_shift = ycs;
  img->bps = bps;

  /* Calculate strides */
  img->stride[AOM_PLANE_Y] = stride_in_bytes;
  img->stride[AOM_PLANE_U] = img->stride[AOM_PLANE_V] = stride_in_bytes >> xcs;

  if (fmt == AOM_IMG_FMT_NV12) {
    // Each row is a row of U and a row of V interleaved, so the stride is twice
    // as long.
    img->stride[AOM_PLANE_U] *= 2;
    img->stride[AOM_PLANE_V] = 0;
  }

  img->cp = AOM_CICP_CP_UNSPECIFIED;
  img->tc = AOM_CICP_TC_UNSPECIFIED;
  img->mc = AOM_CICP_MC_UNSPECIFIED;

  /* Default viewport to entire image. (This aom_img_set_rect call always
   * succeeds.) */
  int ret = aom_img_set_rect(img, 0, 0, d_w, d_h, border);
  assert(ret == 0);
  (void)ret;
  return img;

fail:
  aom_img_free(img);
  return NULL;
}